

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

void __thiscall
cfd::js::api::json::GetCommitmentRequest::ConvertFromStruct
          (GetCommitmentRequest *this,GetCommitmentRequestStruct *data)

{
  GetCommitmentRequestStruct *data_local;
  GetCommitmentRequest *this_local;
  
  this->amount_ = data->amount;
  std::__cxx11::string::operator=((string *)&this->asset_,(string *)&data->asset);
  std::__cxx11::string::operator=
            ((string *)&this->asset_blind_factor_,(string *)&data->asset_blind_factor);
  std::__cxx11::string::operator=((string *)&this->blind_factor_,(string *)&data->blind_factor);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->ignore_items,&data->ignore_items);
  return;
}

Assistant:

void GetCommitmentRequest::ConvertFromStruct(
    const GetCommitmentRequestStruct& data) {
  amount_ = data.amount;
  asset_ = data.asset;
  asset_blind_factor_ = data.asset_blind_factor;
  blind_factor_ = data.blind_factor;
  ignore_items = data.ignore_items;
}